

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGeneratorTarget *target;
  string result;
  cmGeneratorTarget *local_48;
  string local_40;
  
  local_48 = TargetArtifactBase::GetTarget
                       (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if (local_48 == (cmGeneratorTarget *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::
    _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
    ::_M_insert_unique<cmGeneratorTarget*const&>
              ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                *)&context->DependTargets,&local_48);
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&context->AllTargets,&local_48);
    TargetFilesystemArtifactResultCreator<ArtifactNameTag>::Create_abi_cxx11_
              (&local_40,(TargetFilesystemArtifactResultCreator<ArtifactNameTag> *)local_48,
               (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,
               (GeneratorExpressionContent *)dagChecker);
    if (context->HadError == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_40);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }